

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pm_matrix_tests.h
# Opt level: O0

void test_ru_u_row_access<Gudhi::persistence_matrix::Matrix<RU_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,true,true,false,true,true,true,true>>>
               (void)

{
  allocator<unsigned_int> *this;
  initializer_list<unsigned_int> __l;
  initializer_list<unsigned_int> __l_00;
  initializer_list<unsigned_int> __l_01;
  initializer_list<unsigned_int> __l_02;
  initializer_list<unsigned_int> __l_03;
  initializer_list<unsigned_int> __l_04;
  initializer_list<unsigned_int> __l_05;
  bool bVar1;
  reference witness;
  Row *this_00;
  uint local_50c;
  reference local_508;
  Entry<Gudhi::persistence_matrix::Matrix<RU_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false,_true,_true,_true,_true>_>_>
  *entry;
  iterator __end0_1;
  iterator __begin0_1;
  Row *__range2;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *r;
  iterator __end0;
  iterator __begin0;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  *__range1;
  undefined1 local_4c0 [4];
  uint i;
  column_content<typename_Matrix<RU_vine_options_with_row_access<(Column_types)7,_true,_true,_false,_true,_true,_true,_true>_>::Column>
  orderedRows;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_478;
  allocator<unsigned_int> local_45d;
  uint local_45c [3];
  iterator local_450;
  size_type local_448;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_440;
  allocator<unsigned_int> local_425;
  uint local_424;
  iterator local_420;
  size_type local_418;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_410;
  allocator<unsigned_int> local_3f5;
  uint local_3f4;
  iterator local_3f0;
  size_type local_3e8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_3e0;
  allocator<unsigned_int> local_3c5;
  uint local_3c4;
  iterator local_3c0;
  size_type local_3b8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_3b0;
  allocator<unsigned_int> local_395;
  uint local_394;
  iterator local_390;
  size_type local_388;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_380;
  allocator<unsigned_int> local_365;
  uint local_364;
  iterator local_360;
  size_type local_358;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_350;
  undefined1 local_338 [8];
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  rows;
  undefined1 local_310 [8];
  Matrix<RU_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false,_true,_true,_true,_true>_>
  m;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  columns;
  
  build_simple_boundary_matrix<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,true,true,false,true,true,true,true>>>>
            ();
  Gudhi::persistence_matrix::
  Matrix<RU_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,true,true,false,true,true,true,true>>
  ::Matrix<std::vector<unsigned_int,std::allocator<unsigned_int>>>
            ((Matrix<RU_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,true,true,false,true,true,true,true>>
              *)local_310,
             (vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
              *)&m.matrix_.operators_,5);
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::vector((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
            *)local_338);
  local_364 = 0;
  local_360 = &local_364;
  local_358 = 1;
  std::allocator<unsigned_int>::allocator(&local_365);
  __l_05._M_len = local_358;
  __l_05._M_array = local_360;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_350,__l_05,&local_365);
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::push_back((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               *)local_338,&local_350);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_350);
  std::allocator<unsigned_int>::~allocator(&local_365);
  local_394 = 1;
  local_390 = &local_394;
  local_388 = 1;
  std::allocator<unsigned_int>::allocator(&local_395);
  __l_04._M_len = local_388;
  __l_04._M_array = local_390;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_380,__l_04,&local_395);
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::push_back((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               *)local_338,&local_380);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_380);
  std::allocator<unsigned_int>::~allocator(&local_395);
  local_3c4 = 2;
  local_3c0 = &local_3c4;
  local_3b8 = 1;
  std::allocator<unsigned_int>::allocator(&local_3c5);
  __l_03._M_len = local_3b8;
  __l_03._M_array = local_3c0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_3b0,__l_03,&local_3c5);
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::push_back((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               *)local_338,&local_3b0);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_3b0);
  std::allocator<unsigned_int>::~allocator(&local_3c5);
  local_3f4 = 3;
  local_3f0 = &local_3f4;
  local_3e8 = 1;
  std::allocator<unsigned_int>::allocator(&local_3f5);
  __l_02._M_len = local_3e8;
  __l_02._M_array = local_3f0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_3e0,__l_02,&local_3f5);
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::push_back((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               *)local_338,&local_3e0);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_3e0);
  std::allocator<unsigned_int>::~allocator(&local_3f5);
  local_424 = 4;
  local_420 = &local_424;
  local_418 = 1;
  std::allocator<unsigned_int>::allocator(&local_425);
  __l_01._M_len = local_418;
  __l_01._M_array = local_420;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_410,__l_01,&local_425);
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::push_back((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               *)local_338,&local_410);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_410);
  std::allocator<unsigned_int>::~allocator(&local_425);
  local_45c[0] = 3;
  local_45c[1] = 4;
  local_45c[2] = 5;
  local_450 = local_45c;
  local_448 = 3;
  std::allocator<unsigned_int>::allocator(&local_45d);
  __l_00._M_len = local_448;
  __l_00._M_array = local_450;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_440,__l_00,&local_45d);
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::push_back((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               *)local_338,&local_440);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_440);
  std::allocator<unsigned_int>::~allocator(&local_45d);
  orderedRows._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ = 6;
  this = (allocator<unsigned_int> *)
         ((long)&orderedRows._M_t._M_impl.super__Rb_tree_header._M_node_count + 3);
  std::allocator<unsigned_int>::allocator(this);
  __l._M_len = 1;
  __l._M_array = (iterator)((long)&orderedRows._M_t._M_impl.super__Rb_tree_header._M_node_count + 4)
  ;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_478,__l,this);
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::push_back((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               *)local_338,&local_478);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_478);
  std::allocator<unsigned_int>::~allocator
            ((allocator<unsigned_int> *)
             ((long)&orderedRows._M_t._M_impl.super__Rb_tree_header._M_node_count + 3));
  std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::set
            ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)local_4c0)
  ;
  __range1._4_4_ = 0;
  __end0 = std::
           vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
           ::begin((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                    *)local_338);
  r = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
      std::
      vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      ::end((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             *)local_338);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end0,(__normal_iterator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
                                *)&r);
    if (!bVar1) break;
    witness = __gnu_cxx::
              __normal_iterator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
              ::operator*(&__end0);
    std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::clear
              ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
               local_4c0);
    this_00 = Gudhi::persistence_matrix::
              Matrix<RU_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false,_true,_true,_true,_true>_>
              ::get_row((Matrix<RU_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false,_true,_true,_true,_true>_>
                         *)local_310,__range1._4_4_,false);
    __end0_1 = std::
               set<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<RU_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false,_true,_true,_true,_true>_>_>,_Gudhi::persistence_matrix::Matrix<RU_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false,_true,_true,_true,_true>_>::RowEntryComp,_std::allocator<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<RU_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false,_true,_true,_true,_true>_>_>_>_>
               ::begin(this_00);
    entry = (Entry<Gudhi::persistence_matrix::Matrix<RU_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false,_true,_true,_true,_true>_>_>
             *)std::
               set<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<RU_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false,_true,_true,_true,_true>_>_>,_Gudhi::persistence_matrix::Matrix<RU_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false,_true,_true,_true,_true>_>::RowEntryComp,_std::allocator<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<RU_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false,_true,_true,_true,_true>_>_>_>_>
               ::end(this_00);
    while( true ) {
      bVar1 = std::operator!=(&__end0_1,(_Self *)&entry);
      if (!bVar1) break;
      local_508 = std::
                  _Rb_tree_const_iterator<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<RU_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false,_true,_true,_true,_true>_>_>_>
                  ::operator*(&__end0_1);
      local_50c = Gudhi::persistence_matrix::Entry_column_index<unsigned_int>::get_column_index
                            (&local_508->super_Entry_column_index_option);
      std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::insert
                ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
                 local_4c0,&local_50c);
      std::
      _Rb_tree_const_iterator<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<RU_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false,_true,_true,_true,_true>_>_>_>
      ::operator++(&__end0_1);
    }
    test_column_equality<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,true,true,false,true,true,true,true>>>>
              (witness,(column_content<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false,_true,_true,_true,_true>_>_>_>
                        *)local_4c0);
    __gnu_cxx::
    __normal_iterator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
    ::operator++(&__end0);
    __range1._4_4_ = __range1._4_4_ + 1;
  }
  std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::~set
            ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)local_4c0)
  ;
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::~vector((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             *)local_338);
  Gudhi::persistence_matrix::
  Matrix<RU_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false,_true,_true,_true,_true>_>
  ::~Matrix((Matrix<RU_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false,_true,_true,_true,_true>_>
             *)local_310);
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::~vector((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             *)&m.matrix_.operators_);
  return;
}

Assistant:

void test_ru_u_row_access() {
  auto columns = build_simple_boundary_matrix<typename Matrix::Column>();
  Matrix m(columns, 5);

  std::vector<witness_content<typename Matrix::Column> > rows;
  if constexpr (Matrix::Option_list::is_z2) {
    rows.push_back({0});
    rows.push_back({1});
    rows.push_back({2});
    rows.push_back({3});
    rows.push_back({4});
    rows.push_back({3, 4, 5});
    rows.push_back({6});
  } else {
    rows.push_back({{0, 1}});
    rows.push_back({{1, 1}});
    rows.push_back({{2, 1}});
    rows.push_back({{3, 1}, {5, 4}});
    rows.push_back({{4, 1}, {5, 4}});
    rows.push_back({{5, 1}});
    rows.push_back({{6, 1}});
  }

  column_content<typename Matrix::Column> orderedRows;
  unsigned int i = 0;
  for (auto& r : rows) {
    orderedRows.clear();
    for (const auto& entry : m.get_row(i++, false)) {
      if constexpr (Matrix::Option_list::is_z2) {
        orderedRows.insert(entry.get_column_index());
      } else {
        orderedRows.insert({entry.get_column_index(), entry.get_element()});
      }
    }
    test_column_equality<typename Matrix::Column>(r, orderedRows);
  }
}